

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meaning.cpp
# Opt level: O3

Trampoline * __thiscall
SetMeaning::Eval(Trampoline *__return_storage_ptr__,SetMeaning *this,Sexp *act)

{
  Sexp *local_48;
  Sexp *value;
  ContractFrameProtector __contract_frame;
  Sexp *act_local;
  FrameProtector __frame_prot;
  
  __contract_frame.protected_frame = (ContractFrame *)act;
  ContractFrameProtector::ContractFrameProtector((ContractFrameProtector *)&value,"Eval");
  ContractFrame::CheckPrecondition
            ((ContractFrame *)value,act->kind == ACTIVATION,"act->IsActivation()");
  FrameProtector::FrameProtector((FrameProtector *)&act_local,"Eval");
  FrameProtector::ProtectValue((FrameProtector *)&act_local,(Sexp **)&__contract_frame,"act");
  local_48 = (Sexp *)0x0;
  FrameProtector::ProtectValue((FrameProtector *)&act_local,&local_48,"value");
  local_48 = Evaluate(this->binding_value,(Sexp *)__contract_frame.protected_frame);
  Activation::Set((Activation *)(__contract_frame.protected_frame)->function_name,this->up_index,
                  this->right_index,local_48);
  __return_storage_ptr__->kind = Value;
  (__return_storage_ptr__->field_1).value = &g_the_empty_sexp;
  FrameProtector::~FrameProtector((FrameProtector *)&act_local);
  ContractFrameProtector::~ContractFrameProtector((ContractFrameProtector *)&value);
  return __return_storage_ptr__;
}

Assistant:

Trampoline SetMeaning::Eval(Sexp *act) {
  CONTRACT { PRECONDITION(act->IsActivation()); }